

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.hpp
# Opt level: O1

Clause * Kernel::Clause::fromIterator<Lib::VirtualIterator<Kernel::Literal*>>
                   (VirtualIterator<Kernel::Literal_*> *litit,Inference *inf)

{
  int *piVar1;
  Clause *pCVar2;
  VirtualIterator<Kernel::Literal_*> local_50;
  Inference local_48;
  
  if (fromIterator<Lib::VirtualIterator<Kernel::Literal*>>(Lib::VirtualIterator<Kernel::Literal*>,Kernel::Inference_const&)
      ::st == '\0') {
    fromIterator<Lib::VirtualIterator<Kernel::Literal*>>();
  }
  fromIterator<Lib::VirtualIterator<Kernel::Literal_*>_>::st._cursor =
       fromIterator<Lib::VirtualIterator<Kernel::Literal_*>_>::st._stack;
  local_50 = (VirtualIterator<Kernel::Literal_*>)litit->_core;
  if (local_50._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
    (local_50._core)->_refCnt = (local_50._core)->_refCnt + 1;
  }
  ::Lib::Stack<Kernel::Literal*>::loadFromIterator<Lib::VirtualIterator<Kernel::Literal*>>
            ((Stack<Kernel::Literal*> *)&fromIterator<Lib::VirtualIterator<Kernel::Literal_*>_>::st,
             &local_50);
  if (local_50._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
    piVar1 = &(local_50._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_50._core)->_vptr_IteratorCore[1])();
    }
  }
  local_48._0_8_ = *(undefined8 *)inf;
  local_48._8_4_ = *(undefined4 *)&inf->field_0x8;
  local_48._age = inf->_age;
  local_48._splits = inf->_splits;
  local_48._ptr1 = inf->_ptr1;
  local_48._ptr2 = inf->_ptr2;
  local_48.th_ancestors = inf->th_ancestors;
  local_48.all_ancestors = inf->all_ancestors;
  pCVar2 = fromStack(&fromIterator<Lib::VirtualIterator<Kernel::Literal_*>_>::st,&local_48);
  return pCVar2;
}

Assistant:

static Clause* fromIterator(Iter litit, const Inference& inf)
  {
    static Stack<Literal*> st;
    st.reset();
    st.loadFromIterator(std::move(litit));
    return fromStack(st, inf);
  }